

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O1

void make_engr_at(level *lev,int x,int y,char *s,long e_time,xchar e_type)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  engr *peVar5;
  char *pcVar6;
  size_t __n;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    sVar4 = strlen(s);
    __n = 0xff;
    if (sVar4 < 0xff) {
      __n = sVar4;
    }
    peVar5 = lev->lev_engr;
    while( true ) {
      if (peVar5 == (engr *)0x0) break;
      if ((peVar5->engr_x == (char)x) && (peVar5->engr_y == (char)y)) goto LAB_00198e19;
      peVar5 = peVar5->nxt_engr;
    }
    peVar5 = (engr *)0x0;
LAB_00198e19:
    if (peVar5 != (engr *)0x0) {
      del_engr(lev,peVar5);
    }
    peVar5 = (engr *)malloc(__n + 0x29);
    memset(peVar5,0,__n + 0x29);
    peVar5->nxt_engr = lev->lev_engr;
    lev->lev_engr = peVar5;
    peVar5->engr_x = (char)x;
    peVar5->engr_y = (char)y;
    peVar5->engr_txt = (char *)(peVar5 + 1);
    strncpy((char *)(peVar5 + 1),s,__n);
    *(undefined1 *)((long)&peVar5[1].nxt_engr + __n) = 0;
    if (*(char *)&peVar5[1].nxt_engr == ' ') {
      pcVar6 = (char *)((long)&peVar5[1].nxt_engr + 1);
      do {
        peVar5->engr_txt = pcVar6;
        cVar1 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while (cVar1 == ' ');
    }
    if ((in_mklev == '\0') && (iVar2 = strcmp(s,"Elbereth"), iVar2 == 0)) {
      exercise(2,'\x01');
    }
    peVar5->engr_time = e_time;
    if (e_type < '\x01') {
      uVar3 = mt_random();
      e_type = (char)uVar3 + (char)(uVar3 / 5) * -5 + '\x01';
    }
    peVar5->engr_type = e_type;
    peVar5->engr_lth = (int)__n + 1;
  }
  return;
}

Assistant:

void make_engr_at(struct level *lev, int x, int y,
		  const char *s, long e_time, xchar e_type)
{
	struct engr *ep;
	size_t engr_len;

	if (!s || !*s)
	    return;

	engr_len = strlen(s);
	if (engr_len > BUFSZ - 1)
	    engr_len = BUFSZ - 1;

	if ((ep = engr_at(lev, x,y)) != 0)
	    del_engr(lev, ep);
	ep = newengr(engr_len + 1);
	memset(ep, 0, sizeof(struct engr) + engr_len + 1);
	ep->nxt_engr = lev->lev_engr;
	lev->lev_engr = ep;
	ep->engr_x = x;
	ep->engr_y = y;
	ep->engr_txt = (char *)(ep + 1);
	strncpy(ep->engr_txt, s, engr_len);
	ep->engr_txt[engr_len] = '\0';
	while (ep->engr_txt[0] == ' ')
	    ep->engr_txt++;
	/* engraving Elbereth shows wisdom */
	if (!in_mklev && !strcmp(s, "Elbereth")) exercise(A_WIS, TRUE);
	ep->engr_time = e_time;
	ep->engr_type = e_type > 0 ? e_type : rnd(N_ENGRAVE-1);
	ep->engr_lth = engr_len + 1;
}